

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O2

void __thiscall
ktx::CommandExtract::unpackAndSave422
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,char *data,size_t size)

{
  uint32_t numBits;
  pointer psVar1;
  ulong uVar2;
  int iVar3;
  pointer pcVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  sample *psVar10;
  char *pixel;
  int iVar11;
  pointer psVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint32_t uVar16;
  ulong uVar17;
  ulong uVar18;
  char *data_00;
  VkFormat vkFormat_00;
  int iVar19;
  int iVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint uVar23;
  long lVar24;
  uint32_t uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  char *data_01;
  uint uVar29;
  uint uVar30;
  uint32_t uVar31;
  char *data_02;
  uint32_t local_26c;
  uint32_t local_268;
  uint32_t local_264;
  uint32_t local_260;
  uint local_25c;
  uint local_258;
  uint local_254;
  uint local_250;
  anon_class_1_0_00000001 interpolateUV;
  anon_class_1_0_00000001 interpolateY;
  int local_248;
  uint32_t local_244;
  float valueRightV;
  float valueRightU;
  float valueRightY0;
  float valueV;
  float valueU;
  float valueY1;
  float valueY0;
  float valueLeftV;
  float valueLeftU;
  float valueLeftY1;
  float blockSize;
  float positionV;
  float positionU;
  float positionY1;
  float positionY0;
  uint32_t channelBytes;
  CommandExtract *local_1b0;
  ulong local_1a8;
  string *local_1a0;
  long local_198;
  ulong local_190;
  long local_188;
  long local_180;
  vector<char,_std::allocator<char>_> unpackedData;
  anon_class_160_20_da61d305 setPixel;
  string local_c0;
  FormatDescriptor unpackedFormat;
  
  local_260 = width;
  local_1b0 = this;
  local_1a0 = filepath;
  if (*(char *)&format->basic != '\x02') {
    __assert_fail("format.model() == KHR_DF_MODEL_YUVSDA",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x227,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  psVar10 = FormatDescriptor::find(format,KHR_DF_CHANNEL_ASTC_DATA);
  if (psVar10 == (sample *)0x0) {
    __assert_fail("format.find(KHR_DF_CHANNEL_YUVSDA_Y)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x228,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  psVar10 = FormatDescriptor::find(format,KHR_DF_CHANNEL_ASTC_DATA);
  uVar5 = *(uint *)psVar10 >> 0x10 & 0xff;
  numBits = uVar5 + 1;
  if ((char)(*(uint *)psVar10 >> 0x10) == '\a') {
    vkFormat_00 = VK_FORMAT_R8G8B8A8_UNORM;
  }
  else if (uVar5 == 9) {
    vkFormat_00 = VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16;
  }
  else if (uVar5 == 0xb) {
    vkFormat_00 = VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16;
  }
  else {
    vkFormat_00 = VK_FORMAT_R16G16B16A16_UNORM;
    if (numBits != 0x10) {
      vkFormat_00 = VK_FORMAT_UNDEFINED;
    }
  }
  createFormatDescriptor(&unpackedFormat,vkFormat_00,&(local_1b0->super_Command).super_Reporter);
  FormatDescriptor::removeLastChannel(&unpackedFormat);
  uVar17 = *(ulong *)&format->basic;
  channelBytes = (uint32_t)(byte)((unpackedFormat.basic._8_2_ & 0xff) / 3);
  psVar12 = (format->samples).
            super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
            _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (format->samples).
           super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (((long)psVar1 - (long)psVar12 & 0xffffffff0U) != 0x40) {
    __assert_fail("format.sampleCount() == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23a,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if ((uVar17 & 0xff00000000) != 0x100000000) {
    __assert_fail("format.basic.texelBlockDimension0 + 1 == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23b,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if ((char)(uVar17 >> 0x28) != '\0') {
    __assert_fail("format.basic.texelBlockDimension1 + 1 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23c,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if ((char)(uVar17 >> 0x30) != '\0') {
    __assert_fail("format.basic.texelBlockDimension2 + 1 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23d,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if (uVar17 >> 0x38 != 0) {
    __assert_fail("format.basic.texelBlockDimension3 + 1 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23e,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  uVar29 = ((uint)(uVar17 >> 0x20) & 0xff) + 1;
  uVar5 = (uint)(byte)(format->basic).field_0x8;
  if ((ulong)(uVar5 * height * local_260) / (ulong)uVar29 != size) {
    __assert_fail("size == width * height * blockYUVBytes / blockDimensionX / blockDimensionY",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23f,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  uVar26 = unpackedFormat.basic._8_4_ & 0xff;
  local_26c = 0;
  local_268 = 0;
  local_264 = 0;
  uVar9 = 0;
  uVar23 = 0;
  uVar25 = 0;
  local_250 = 0;
  uVar27 = 0;
  local_254 = 0;
  uVar17 = 0;
  uVar21 = 0;
  uVar8 = 0;
  for (; psVar12 != psVar1; psVar12 = psVar12 + 1) {
    uVar2 = *(ulong *)psVar12;
    uVar30 = (uint)(uVar2 >> 0x18) & 0xf;
    uVar13 = (uint)(uVar2 >> 0x20);
    uVar7 = (uint)(uVar2 >> 0x10);
    uVar18 = uVar17;
    uVar22 = uVar21;
    uVar6 = uVar8;
    if (uVar30 == 2) {
      local_250 = (uint)uVar2 & 0xffff;
      uVar25 = (uVar7 & 0xff) + 1;
      uVar23 = uVar13 & 0xff;
    }
    else if (uVar30 == 1) {
      local_254 = (uint)uVar2 & 0xffff;
      local_26c = (uVar7 & 0xff) + 1;
      uVar27 = uVar13 & 0xff;
    }
    else {
      if ((uVar2 & 0xf000000) != 0) {
        __assert_fail("false && \"Unsupported channel type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                      ,0x268,
                      "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                     );
      }
      uVar31 = (uVar7 & 0xff) + 1;
      uVar18 = uVar2 & 0xffff;
      uVar22 = uVar31;
      uVar6 = uVar13 & 0xff;
      if (uVar21 != 0) {
        local_268 = (uint32_t)uVar18;
        uVar18 = uVar17;
        uVar22 = uVar21;
        uVar6 = uVar8;
        local_264 = uVar31;
        uVar9 = uVar13 & 0xff;
      }
    }
    uVar17 = uVar18;
    uVar21 = uVar22;
    uVar8 = uVar6;
  }
  uVar22 = uVar21;
  uVar7 = uVar8;
  local_244 = (uint32_t)uVar17;
  if (uVar8 <= uVar9) {
    local_244 = local_268;
    uVar22 = local_264;
    uVar7 = uVar9;
    local_264 = uVar21;
    uVar9 = uVar8;
    local_268 = (uint32_t)uVar17;
  }
  if (numBits == local_264) {
    if (numBits != uVar22) {
      __assert_fail("precision == y1Bits",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                    ,0x273,
                    "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                   );
    }
    if (numBits == local_26c) {
      if (numBits == uVar25) {
        positionY0 = (float)(uVar9 * uVar29) * 0.00390625;
        positionY1 = (float)(uVar7 * uVar29) * 0.00390625;
        positionU = (float)(uVar27 * uVar29) * 0.00390625;
        blockSize = (float)uVar29;
        positionV = (float)(uVar23 * uVar29) * 0.00390625;
        std::vector<char,_std::allocator<char>_>::vector
                  (&unpackedData,(ulong)(height * local_260 * uVar26),(allocator_type *)&setPixel);
        local_248 = 0;
        local_1a8 = (ulong)local_260 / (ulong)uVar29;
        iVar3 = (int)local_1a8;
        local_190 = (ulong)(iVar3 - 1);
        local_188 = -local_1a8;
        iVar11 = local_260 * uVar26;
        local_198 = -local_190;
        local_258 = 0;
        local_25c = 0;
        for (uVar16 = 0; uVar16 != height; uVar16 = uVar16 + 1) {
          iVar14 = uVar16 * (int)local_1a8;
          iVar15 = 0;
          iVar19 = 1;
          lVar24 = 0;
          iVar20 = local_248;
          uVar23 = local_258;
          uVar29 = local_25c;
          while( true ) {
            pcVar4 = unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (local_188 == lVar24) break;
            data_02 = data + (iVar20 - (uint)(iVar15 != 0)) * uVar5;
            data_00 = data + uVar23;
            iVar28 = iVar19;
            if (local_198 == lVar24) {
              iVar28 = (int)local_190;
            }
            data_01 = data + (iVar28 + iVar14) * uVar5;
            pixel = unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar29;
            local_180 = lVar24;
            uVar8 = imageio::extract_bits<unsigned_int>(data_02,local_244,numBits);
            valueLeftY1 = imageio::convertUNORMToFloat(uVar8,numBits);
            uVar8 = imageio::extract_bits<unsigned_int>(data_02,local_254,local_26c);
            valueLeftU = imageio::convertUNORMToFloat(uVar8,local_26c);
            uVar8 = imageio::extract_bits<unsigned_int>(data_02,local_250,numBits);
            valueLeftV = imageio::convertUNORMToFloat(uVar8,numBits);
            uVar21 = local_268;
            uVar8 = imageio::extract_bits<unsigned_int>(data_00,local_268,local_264);
            valueY0 = imageio::convertUNORMToFloat(uVar8,local_264);
            uVar8 = imageio::extract_bits<unsigned_int>(data_00,local_244,numBits);
            valueY1 = imageio::convertUNORMToFloat(uVar8,numBits);
            uVar8 = local_254;
            uVar9 = imageio::extract_bits<unsigned_int>(data_00,local_254,local_26c);
            valueU = imageio::convertUNORMToFloat(uVar9,local_26c);
            uVar9 = local_250;
            uVar27 = imageio::extract_bits<unsigned_int>(data_00,local_250,numBits);
            valueV = imageio::convertUNORMToFloat(uVar27,numBits);
            uVar27 = imageio::extract_bits<unsigned_int>(data_01,uVar21,local_264);
            valueRightY0 = imageio::convertUNORMToFloat(uVar27,local_264);
            uVar8 = imageio::extract_bits<unsigned_int>(data_01,uVar8,local_26c);
            valueRightU = imageio::convertUNORMToFloat(uVar8,local_26c);
            uVar8 = imageio::extract_bits<unsigned_int>(data_01,uVar9,numBits);
            valueRightV = imageio::convertUNORMToFloat(uVar8,numBits);
            setPixel.interpolateUV = &interpolateUV;
            setPixel.positionV = &positionV;
            setPixel.blockSize = &blockSize;
            setPixel.valueLeftV = &valueLeftV;
            setPixel.valueV = &valueV;
            setPixel.valueRightV = &valueRightV;
            setPixel.uBits = &local_26c;
            setPixel.interpolateY = &interpolateY;
            setPixel.positionY1 = &positionY1;
            setPixel.valueLeftY1 = &valueLeftY1;
            setPixel.positionY0 = &positionY0;
            setPixel.valueY0 = &valueY0;
            setPixel.valueY1 = &valueY1;
            setPixel.valueRightY0 = &valueRightY0;
            setPixel.y0Bits = &local_264;
            setPixel.positionU = &positionU;
            setPixel.valueLeftU = &valueLeftU;
            setPixel.valueU = &valueU;
            setPixel.valueRightU = &valueRightU;
            setPixel.channelBytes = &channelBytes;
            unpackAndSave422(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,char_const*,unsigned_long)
            ::$_0::operator()(&setPixel,pixel,0.5);
            unpackAndSave422(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,char_const*,unsigned_long)
            ::$_0::operator()(&setPixel,pcVar4 + (uVar26 + uVar29),1.5);
            lVar24 = local_180 + -1;
            uVar29 = uVar29 + uVar26 * 2;
            uVar23 = uVar23 + uVar5;
            iVar20 = iVar20 + 1;
            iVar15 = iVar15 + 1;
            iVar19 = iVar19 + 1;
          }
          local_25c = local_25c + iVar11;
          local_258 = local_258 + iVar3 * uVar5;
          local_248 = local_248 + (int)local_1a8;
        }
        std::__cxx11::string::string((string *)&local_c0,(string *)local_1a0);
        savePNG(local_1b0,&local_c0,appendExtension,VK_FORMAT_UNDEFINED,&unpackedFormat,local_260,
                height,unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                (long)unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)unpackedData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&local_c0);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&unpackedData.super__Vector_base<char,_std::allocator<char>_>);
        FormatDescriptor::~FormatDescriptor(&unpackedFormat);
        return;
      }
      __assert_fail("precision == vBits",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                    ,0x275,
                    "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                   );
    }
    __assert_fail("precision == uBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x274,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  __assert_fail("precision == y0Bits",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                ,0x272,
                "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
               );
}

Assistant:

void CommandExtract::unpackAndSave422(std::string filepath, bool appendExtension,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height,
        const char* data, std::size_t size) {
    (void) vkFormat;

    assert(format.model() == KHR_DF_MODEL_YUVSDA);
    assert(format.find(KHR_DF_CHANNEL_YUVSDA_Y));
    // Create a custom format with the same precision but with only 3 channels
    // Reuse similar 4 channel VkFormats and drop the last channel (There is no RGB variant of 10X6 and 12X4)
    const auto precision = format.find(KHR_DF_CHANNEL_YUVSDA_Y)->bitLength + 1u;
    auto unpackedFormat = createFormatDescriptor(
            precision == 8 ? VK_FORMAT_R8G8B8A8_UNORM :
            precision == 10 ? VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16 :
            precision == 12 ? VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16 :
            precision == 16 ? VK_FORMAT_R16G16B16A16_UNORM :
            VK_FORMAT_UNDEFINED, *this);
    unpackedFormat.removeLastChannel();

    // 1 pixel (block) with 4 channel is unpacked to 2 pixel with 3 channels: Y0,Y1,U,V -> R0,G0,B0,R1,G1,B1
    const auto blockYUVBytes = format.pixelByteCount();
    const auto blockDimensionX = format.basic.texelBlockDimension0 + 1;
    const auto blockDimensionY = format.basic.texelBlockDimension1 + 1;
    const auto pixelBytes = unpackedFormat.pixelByteCount();
    const auto channelBytes = pixelBytes / 3;
    assert(format.sampleCount() == 4);
    assert(format.basic.texelBlockDimension0 + 1 == 2);
    assert(format.basic.texelBlockDimension1 + 1 == 1);
    assert(format.basic.texelBlockDimension2 + 1 == 1);
    assert(format.basic.texelBlockDimension3 + 1 == 1);
    assert(size == width * height * blockYUVBytes / blockDimensionX / blockDimensionY);
    (void) size;
    (void) blockDimensionY;

    uint32_t y0Offset = 0;
    uint32_t y0Bits = 0;
    uint32_t y0PositionX = 0;
    uint32_t y1Offset = 0;
    uint32_t y1Bits = 0;
    uint32_t y1PositionX = 0;
    uint32_t uOffset = 0;
    uint32_t uBits = 0;
    uint32_t uPositionX = 0;
    uint32_t vOffset = 0;
    uint32_t vBits = 0;
    uint32_t vPositionX = 0;

    for (const auto& sample : format.samples) {
        switch (sample.channelType) {
        case KHR_DF_CHANNEL_YUVSDA_Y:
            if (y0Bits != 0) {
                y1Offset = sample.bitOffset;
                y1Bits = sample.bitLength + 1;
                y1PositionX = sample.samplePosition0;
            } else {
                y0Offset = sample.bitOffset;
                y0Bits = sample.bitLength + 1;
                y0PositionX = sample.samplePosition0;
            }
            break;
        case KHR_DF_CHANNEL_YUVSDA_U:
            uOffset = sample.bitOffset;
            uBits = sample.bitLength + 1;
            uPositionX = sample.samplePosition0;
            break;
        case KHR_DF_CHANNEL_YUVSDA_V:
            vOffset = sample.bitOffset;
            vBits = sample.bitLength + 1;
            vPositionX = sample.samplePosition0;
            break;
        default:
            assert(false && "Unsupported channel type");
        }
    }
    if (y0PositionX > y1PositionX) {
        // Ensure that y0 (as we refer to) is the left sample
        std::swap(y0Offset, y1Offset);
        std::swap(y0Bits, y1Bits);
        std::swap(y0PositionX, y1PositionX);
    }

    assert(precision == y0Bits);
    assert(precision == y1Bits);
    assert(precision == uBits);
    assert(precision == vBits);

    const float positionY0 = static_cast<float>(y0PositionX * blockDimensionX) / 256.f;
    const float positionY1 = static_cast<float>(y1PositionX * blockDimensionX) / 256.f;
    const float positionU = static_cast<float>(uPositionX * blockDimensionX) / 256.f;
    const float positionV = static_cast<float>(vPositionX * blockDimensionX) / 256.f;
    const float blockSize = static_cast<float>(blockDimensionX);

    std::vector<char> unpackedData(width * height * pixelBytes);

    const auto blockCountX = width / blockDimensionX;
    for (uint32_t y = 0; y < height; y++) {
        for (uint32_t x = 0; x < blockCountX; x++) {
            const char* rawYUVBlockLeft = data + (y * blockCountX + (x == 0 ? 0 : x - 1)) * blockYUVBytes;
            const char* rawYUVBlock = data + (y * blockCountX + x) * blockYUVBytes;
            const char* rawYUVBlockRight = data + (y * blockCountX + (x == blockCountX - 1 ? blockCountX - 1 : x + 1)) * blockYUVBytes;

            char* pixel0 = unpackedData.data() + (y * width + x * 2) * pixelBytes;
            char* pixel1 = unpackedData.data() + (y * width + x * 2 + 1) * pixelBytes;

            const float valueLeftY1 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, y1Offset, y1Bits), y1Bits);
            const float valueLeftU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, uOffset, uBits), uBits);
            const float valueLeftV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, vOffset, vBits), vBits);
            const float valueY0 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, y0Offset, y0Bits), y0Bits);
            const float valueY1 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, y1Offset, y1Bits), y1Bits);
            const float valueU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, uOffset, uBits), uBits);
            const float valueV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, vOffset, vBits), vBits);
            const float valueRightY0 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, y0Offset, y0Bits), y0Bits);
            const float valueRightU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, uOffset, uBits), uBits);
            const float valueRightV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, vOffset, vBits), vBits);

            const auto interpolateY = [](float pos, float pos0, float value0, float pos1, float value1, float pos2, float value2, float pos3, float value3) {
                if (pos < pos1)
                    return remap(pos, pos0, pos1, value0, value1);
                else if (pos < pos2)
                    return remap(pos, pos1, pos2, value1, value2);
                else
                    return remap(pos, pos2, pos3, value2, value3);
            };

            const auto interpolateUV = [](float pos, float pos0, float value0, float pos1, float value1, float pos2, float value2) {
                if (pos < pos1)
                    return remap(pos, pos0, pos1, value0, value1);
                else
                    return remap(pos, pos1, pos2, value1, value2);
            };

            const auto setPixel = [&](auto* pixel, float pos) {
                const auto r = convertFloatToUNORM(interpolateUV(pos,
                        positionV - blockSize, valueLeftV,
                        positionV, valueV,
                        positionV + blockSize, valueRightV), uBits);
                const auto g = convertFloatToUNORM(interpolateY(
                        pos,
                        positionY1 - blockSize, valueLeftY1,
                        positionY0, valueY0,
                        positionY1, valueY1,
                        positionY0 + blockSize, valueRightY0), y0Bits);
                const auto b = convertFloatToUNORM(interpolateUV(pos,
                        positionU - blockSize, valueLeftU,
                        positionU, valueU,
                        positionU + blockSize, valueRightU), uBits);

                const auto offsetToUsedBytes = is_big_endian ? sizeof(r) - channelBytes : 0u;
                std::memcpy(pixel + 0 * channelBytes, &r + offsetToUsedBytes, channelBytes);
                std::memcpy(pixel + 1 * channelBytes, &g + offsetToUsedBytes, channelBytes);
                std::memcpy(pixel + 2 * channelBytes, &b + offsetToUsedBytes, channelBytes);
            };

            setPixel(pixel0, 0.5f);
            setPixel(pixel1, 1.5f);
        }
    }

    // Save unpacked data as RGBSDA with the custom format
    savePNG(filepath, appendExtension, VK_FORMAT_UNDEFINED, unpackedFormat, width, height,
            reinterpret_cast<const char*>(unpackedData.data()),
            unpackedData.size() * sizeof(decltype(unpackedData)::value_type));
}